

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamToolsIndex::Jump
          (BamToolsIndex *this,BamRegion *region,bool *hasAlignmentsInRegion)

{
  BamReaderPrivate *this_00;
  pointer pRVar1;
  bool bVar2;
  RefVector *pRVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t offset;
  string local_60;
  string local_40;
  
  *hasAlignmentsInRegion = false;
  this_00 = (this->super_BamIndex).m_reader;
  if ((this_00 == (BamReaderPrivate *)0x0) || (bVar2 = BamReaderPrivate::IsOpen(this_00), !bVar2)) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamToolsIndex::Jump","");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"could not jump: reader is not open","");
    BamIndex::SetErrorString(&this->super_BamIndex,&local_60,&local_40);
  }
  else {
    pRVar3 = BamReaderPrivate::GetReferenceData((this->super_BamIndex).m_reader);
    uVar5 = (ulong)region->LeftRefID;
    pRVar1 = (pRVar3->super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(pRVar3->
                   super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
            -0x3333333333333333;
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if (region->LeftPosition <= pRVar1[uVar5].RefLength) {
      GetOffset(this,region,(int64_t *)&local_60,hasAlignmentsInRegion);
      bVar2 = BamReaderPrivate::Seek((this->super_BamIndex).m_reader,(int64_t *)&local_60);
      return bVar2;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamToolsIndex::Jump","");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"could not create index: invalid region requested","");
    BamIndex::SetErrorString(&this->super_BamIndex,&local_60,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool BamToolsIndex::Jump(const BamTools::BamRegion& region, bool* hasAlignmentsInRegion) {

    // clear flag
    *hasAlignmentsInRegion = false;

    // skip if invalid reader or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamToolsIndex::Jump", "could not jump: reader is not open");
        return false;
    }

    // make sure left-bound position is valid
    const RefVector& references = m_reader->GetReferenceData();
    if ( region.LeftPosition > references.at(region.LeftRefID).RefLength ) {
        SetErrorString("BamToolsIndex::Jump", "could not create index: invalid region requested");
        return false;
    }

    // calculate nearest offset to jump to
    int64_t offset;
    try {
        GetOffset(region, offset, hasAlignmentsInRegion);
    } catch ( BamException& e ) {
        m_errorString = e.what();
        return false;
    }

    // return success/failure of seek
    return m_reader->Seek(offset);
}